

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

BVSparseNode * __thiscall
BVSparse<Memory::HeapAllocator>::Allocate
          (BVSparse<Memory::HeapAllocator> *this,BVIndex searchIndex,BVSparseNode *nextNode)

{
  HeapAllocator *pHVar1;
  BVSparseNode<Memory::HeapAllocator> *this_00;
  TrackAllocData local_48;
  BVSparseNode *local_20;
  BVSparseNode *nextNode_local;
  BVSparse<Memory::HeapAllocator> *pBStack_10;
  BVIndex searchIndex_local;
  BVSparse<Memory::HeapAllocator> *this_local;
  
  pHVar1 = this->alloc;
  local_20 = nextNode;
  nextNode_local._4_4_ = searchIndex;
  pBStack_10 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&BVSparseNode<Memory::HeapAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SparseBitVector.h"
             ,0x157);
  pHVar1 = Memory::HeapAllocator::TrackAllocInfo(pHVar1,&local_48);
  this_00 = (BVSparseNode<Memory::HeapAllocator> *)new<Memory::HeapAllocator>(0x18,pHVar1,0x21ca90);
  BVSparseNode<Memory::HeapAllocator>::BVSparseNode(this_00,nextNode_local._4_4_,local_20);
  return this_00;
}

Assistant:

BVSparseNode<TAllocator> *
BVSparse<TAllocator>::Allocate(const BVIndex searchIndex, BVSparseNode *nextNode)
{
    return AllocatorNew(TAllocator, this->alloc, BVSparseNode, searchIndex, nextNode);
}